

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int iVar2;
  int sizeWords;
  char **local_478;
  Graph g;
  string message;
  ofstream myfile;
  char local_428 [496];
  ifstream infile;
  
  if (argc == 3) {
    std::ifstream::ifstream((istream *)&infile,argv[1],_S_in);
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length = 0;
    message.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&infile,(string *)&message);
    std::istream::operator>>((istream *)&infile,&sizeWords);
    local_478 = argv;
    Graph::Graph(&g,(int)message._M_string_length);
    for (iVar2 = 0; iVar2 < sizeWords; iVar2 = iVar2 + 1) {
      local_428[0] = '\0';
      _myfile = local_428;
      std::operator>>((istream *)&infile,(string *)&myfile);
      Graph::rk(&g,_myfile,message._M_dataplus._M_p,0x65);
      std::__cxx11::string::~string((string *)&myfile);
    }
    std::ofstream::ofstream(&myfile);
    std::ofstream::open((char *)&myfile,(_Ios_Openmode)local_478[2]);
    Graph::solve(&g);
    std::ostream::_M_insert<long_long>((longlong)&myfile);
    std::ofstream::close();
    std::ofstream::~ofstream(&myfile);
    Graph::~Graph(&g);
    std::__cxx11::string::~string((string *)&message);
    std::ifstream::~ifstream(&infile);
    iVar2 = 0;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Run the code with the following command: ./project5 [input_file] [output_file]"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc != 3) {
        cout << "Run the code with the following command: ./project5 [input_file] [output_file]" << endl;
        return 1;
    }
    ifstream infile(argv[1]);
    string message;
    infile >> message;
    int sizeWords ;
    infile >> sizeWords;
    Graph g(message.length());
    for (int i = 0; i < sizeWords; ++i) {
        string word;
        infile >> word;
        g.rk(word.c_str(),message.c_str(),101);
    }
    ofstream myfile;
    myfile.open(argv[2]);
    myfile << g.solve();
    myfile.close();
    return 0;
}